

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

int __thiscall
absl::lts_20250127::Cord::CompareSlowPath
          (Cord *this,string_view rhs,size_t compared_size,size_t size_to_compare)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  Nonnull<size_t_*> puVar5;
  Nonnull<size_t_*> puVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Dd;
  string_view lhs_chunk;
  ChunkIterator lhs_it;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  size_t local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  ChunkIterator local_c8;
  
  puVar5 = (Nonnull<size_t_*>)rhs._M_str;
  puVar6 = (Nonnull<size_t_*>)rhs._M_len;
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  local_c8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_c8.bytes_remaining_ = 0;
  local_c8.current_chunk_ = (string_view)ZEXT816(0);
  local_c8.btree_reader_.remaining_ = 0;
  local_c8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  tree = (this->contents_).data_.rep_.field_0.as_tree.rep;
  local_e0 = size_to_compare;
  local_d8._M_len = (size_t)puVar6;
  local_d8._M_str = (char *)puVar5;
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) != 0) goto LAB_0023a18d;
    local_c8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
    local_c8.current_chunk_._M_str = (char *)((long)&(this->contents_).data_.rep_.field_0 + 1);
    local_c8.current_chunk_._M_len = local_c8.bytes_remaining_;
  }
  else {
    local_c8.bytes_remaining_ = tree->length;
    if (local_c8.bytes_remaining_ == 0) goto LAB_0023a192;
    ChunkIterator::InitTree(&local_c8,tree);
  }
  do {
    if (local_c8.bytes_remaining_ == 0) {
      local_f8._M_len = 0;
      local_f8._M_str = (char *)0x0;
    }
    else {
      local_f8._M_len = local_c8.current_chunk_._M_len;
      local_f8._M_str = local_c8.current_chunk_._M_str;
    }
    sVar3 = local_f8._M_len - compared_size;
    if (local_f8._M_len < compared_size) {
      __assert_fail("compared_size <= lhs_chunk.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0x394,
                    "int absl::Cord::CompareSlowPath(absl::string_view, size_t, size_t) const");
    }
    bVar7 = puVar6 < compared_size;
    puVar6 = (Nonnull<size_t_*>)((long)puVar6 - compared_size);
    if (bVar7) {
      __assert_fail("compared_size <= rhs.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0x395,
                    "int absl::Cord::CompareSlowPath(absl::string_view, size_t, size_t) const");
    }
    local_f8._M_str = local_f8._M_str + compared_size;
    local_d8._M_str = (char *)((long)puVar5 + compared_size);
    local_e0 = size_to_compare - compared_size;
    compared_size = (size_t)&local_e0;
    size_to_compare = (size_t)&local_c8.btree_reader_;
    puVar5 = (Nonnull<size_t_*>)0x0;
    local_f8._M_len = sVar3;
    local_d8._M_len = (size_t)puVar6;
    while (local_f8._M_len != 0) {
LAB_0023a12c:
      if ((Nonnull<size_t_*>)local_d8._M_len == (Nonnull<size_t_*>)0x0) goto LAB_0023a160;
      uVar2 = anon_unknown_74::CompareChunks(&local_f8,&local_d8,(Nonnull<size_t_*>)compared_size);
      puVar6 = (Nonnull<size_t_*>)((ulong)puVar6 & 0xffffffff);
      if (local_e0 == 0) {
        puVar6 = puVar5;
      }
      if (uVar2 != 0) {
        puVar6 = (Nonnull<size_t_*>)(ulong)uVar2;
        goto LAB_0023a174;
      }
      if (local_e0 == 0) {
LAB_0023a174:
        return (int)puVar6;
      }
    }
    if (local_c8.bytes_remaining_ != 0) {
      uVar4 = local_c8.bytes_remaining_ - local_c8.current_chunk_._M_len;
      if (local_c8.bytes_remaining_ < local_c8.current_chunk_._M_len) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x611,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      local_c8.bytes_remaining_ = uVar4;
      if (uVar4 != 0) {
        if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
           (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if (local_c8.current_chunk_._M_len == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                          ,0x617,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_c8.current_chunk_ = (string_view)ZEXT816(0);
        }
        else {
          local_c8.current_chunk_ =
               cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)size_to_compare);
        }
      }
      if (local_c8.bytes_remaining_ != 0) {
        local_f8._M_len = local_c8.current_chunk_._M_len;
        local_f8._M_str = local_c8.current_chunk_._M_str;
        goto LAB_0023a12c;
      }
LAB_0023a160:
      puVar6 = (Nonnull<size_t_*>)
               (ulong)((uint)((Nonnull<size_t_*>)local_d8._M_len == (Nonnull<size_t_*>)0x0) -
                      (uint)(local_f8._M_len == 0));
      goto LAB_0023a174;
    }
    CompareSlowPath();
LAB_0023a18d:
    CompareSlowPath();
    uVar8 = extraout_XMM0_Da;
    uVar9 = extraout_XMM0_Db;
    uVar10 = extraout_XMM0_Dc;
    uVar11 = extraout_XMM0_Dd;
LAB_0023a192:
    local_c8.current_chunk_._M_len._4_4_ = uVar9;
    local_c8.current_chunk_._M_len._0_4_ = uVar8;
    local_c8.current_chunk_._M_str._0_4_ = uVar10;
    local_c8.current_chunk_._M_str._4_4_ = uVar11;
  } while( true );
}

Assistant:

inline int Cord::CompareSlowPath(absl::string_view rhs, size_t compared_size,
                                 size_t size_to_compare) const {
  auto advance = [](absl::Nonnull<Cord::ChunkIterator*> it,
                    absl::Nonnull<absl::string_view*> chunk) {
    if (!chunk->empty()) return true;
    ++*it;
    if (it->bytes_remaining_ == 0) return false;
    *chunk = **it;
    return true;
  };

  Cord::ChunkIterator lhs_it = chunk_begin();

  // compared_size is inside first chunk.
  absl::string_view lhs_chunk =
      (lhs_it.bytes_remaining_ != 0) ? *lhs_it : absl::string_view();
  assert(compared_size <= lhs_chunk.size());
  assert(compared_size <= rhs.size());
  lhs_chunk.remove_prefix(compared_size);
  rhs.remove_prefix(compared_size);
  size_to_compare -= compared_size;  // skip already compared size.

  while (advance(&lhs_it, &lhs_chunk) && !rhs.empty()) {
    int comparison_result = CompareChunks(&lhs_chunk, &rhs, &size_to_compare);
    if (comparison_result != 0) return comparison_result;
    if (size_to_compare == 0) return 0;
  }

  return static_cast<int>(rhs.empty()) - static_cast<int>(lhs_chunk.empty());
}